

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O2

int GmfWriteByteFlow(int64_t MshIdx,char *BytTab,int NmbByt)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  
  iVar1 = (int)((long)NmbByt / 4);
  iVar6 = iVar1 * 4;
  iVar4 = 0;
  iVar2 = GmfSetKwd(MshIdx,0x7e,
                    (long)(int)((uint)(NmbByt != iVar6 &&
                                      SBORROW4(NmbByt,iVar6) == NmbByt + iVar1 * -4 < 0) + iVar1));
  if (iVar2 != 0) {
    GmfSetLin(MshIdx,0x7e,(ulong)(uint)NmbByt);
    uVar5 = (long)NmbByt / 4 & 0xffffffff;
    if (iVar1 < 1) {
      uVar5 = 0;
    }
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      GmfSetLin(MshIdx,0x7e,(ulong)*(uint *)(BytTab + uVar7 * 4));
    }
    iVar4 = 1;
    uVar8 = NmbByt + iVar1 * -4;
    if (uVar8 != 0 && iVar6 <= NmbByt) {
      uVar7 = 0;
      uVar5 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar5 = uVar7;
      }
      pcVar9 = BytTab + iVar6;
      uVar3 = 0;
      for (; uVar5 * 8 != uVar7; uVar7 = uVar7 + 8) {
        uVar3 = (ulong)((uint)uVar3 | (int)*pcVar9 << ((byte)uVar7 & 0x1f));
        pcVar9 = pcVar9 + 1;
      }
      GmfSetLin(MshIdx,0x7e,uVar3);
    }
  }
  return iVar4;
}

Assistant:

int GmfWriteByteFlow(int64_t MshIdx, char *BytTab, int NmbByt)
{
   int i, PadWrd = 0, *WrdTab = (int *)BytTab, NmbWrd = NmbByt / WrdSiz;

   // Add an extra padding word at the end if needed
   if(NmbByt > NmbWrd * 4)
      PadWrd = 1;

   // Create the keyword with the number of words, not bytes
   if(!GmfSetKwd(MshIdx, GmfByteFlow, NmbWrd + PadWrd))
      return(0);

   // Reacord the exact number of bytes
   GmfSetLin(MshIdx, GmfByteFlow, NmbByt);

   // Write the byteflow as 4-byte words, missing up to 3 endding bytes
   for(i=0;i<NmbWrd;i++)
      GmfSetLin(MshIdx, GmfByteFlow, WrdTab[i]);

   // Write the extra 1,2 or 3 ending bytes
   if(PadWrd)
   {
      PadWrd = 0;

      // Copy the last bytes in an integer
      for(i=0; i<NmbByt - NmbWrd * 4; i++)
         PadWrd |= BytTab[ NmbWrd * 4 + i ] << (i*8);

      // And write it as the last line
      GmfSetLin(MshIdx, GmfByteFlow, PadWrd);
   }

   return(1);
}